

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdDotAdd<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  Value VVar3;
  Value VVar4;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  auVar1 = pmaddwd((undefined1  [16])VVar4.field_0,(undefined1  [16])VVar3.field_0);
  local_18 = VVar2.field_0.i32_;
  uStack_14 = VVar2.field_0._4_4_;
  uStack_10 = VVar2.field_0._8_4_;
  uStack_c = VVar2.field_0._12_4_;
  VVar2.field_0.i64_._4_4_ = auVar1._4_4_ + uStack_14;
  VVar2.field_0.i32_ = auVar1._0_4_ + local_18;
  VVar2.field_0._12_4_ = auVar1._12_4_ + uStack_c;
  VVar2.field_0._8_4_ = auVar1._8_4_ + uStack_10;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDotAdd() {
  using SL = typename S::LaneType;
  auto acc = Pop<S>();
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx] * rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1] * rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
    result[i] = Add(result[i], acc[i]);
  }
  Push(result);
  return RunResult::Ok;
}